

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

double __thiscall lda::lgamma(lda *this,double param_1)

{
  lda_math_mode lVar1;
  ostream *this_00;
  float local_4;
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    local_4 = ldamath::lgamma<float,(lda_math_mode)0>(0.0);
  }
  else if (lVar1 == USE_PRECISE) {
    local_4 = ldamath::lgamma<float,(lda_math_mode)1>(0.0);
  }
  else {
    if (lVar1 != USE_FAST_APPROX) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "lda::lgamma: Trampled or invalid math mode, aborting");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      abort();
    }
    local_4 = ldamath::lgamma<float,(lda_math_mode)2>(0.0);
  }
  return (double)(ulong)(uint)local_4;
}

Assistant:

float lda::lgamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::lgamma FAST_APPROX ";
      return ldamath::lgamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::lgamma PRECISE ";
      return ldamath::lgamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::gamma SIMD ";
      return ldamath::lgamma<float, USE_SIMD>(x);
    default:
      std::cerr << "lda::lgamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}